

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameCollaborativeGraphical.cpp
# Opt level: O1

void __thiscall
BayesianGameCollaborativeGraphical::SanityCheckBGCG(BayesianGameCollaborativeGraphical *this)

{
  pointer ppBVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  
  if (this->_m_nrLRFs != 0) {
    uVar3 = 1;
    uVar4 = 0;
    do {
      ppBVar1 = (this->_m_LRFs).
                super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->_m_LRFs).
                        super__Vector_base<BayesianGameIdenticalPayoff_*,_std::allocator<BayesianGameIdenticalPayoff_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppBVar1 >> 3) <= uVar4) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      (**(code **)(*(long *)&(ppBVar1[uVar4]->super_BayesianGameIdenticalPayoffInterface).
                             super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure +
                  0x78))();
      uVar4 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar4 < this->_m_nrLRFs);
  }
  bVar2 = IsFullyConnected(this);
  if (bVar2) {
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "Warning: BayesianGameCollaborativeGraphical is not fully connected",0x42);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  return;
}

Assistant:

void BayesianGameCollaborativeGraphical::SanityCheckBGCG() const
{
    for(Index e=0; e < _m_nrLRFs; e++)
        _m_LRFs.at(e)->SanityCheck();

    if(!IsFullyConnected())
        cout << "Warning: BayesianGameCollaborativeGraphical is not fully connected"  << endl;
}